

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:169:3)>
 __thiscall
kj::
defer<kj::_::Mutex::lock(kj::_::Mutex::Exclusivity,kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>,kj::NoopSourceLocation)::__0>
          (kj *this,Type *func)

{
  Type *func_00;
  Type *func_local;
  
  func_00 = fwd<kj::_::Mutex::lock(kj::_::Mutex::Exclusivity,kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>,kj::NoopSourceLocation)::__0>
                      (func);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:169:3)>
  ::Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:169:3)>
              *)this,func_00);
  return (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:169:3)>
          )SUB82(this,0);
}

Assistant:

_::Deferred<Func> defer(Func&& func) {
  // Returns an object which will invoke the given functor in its destructor. The object is not
  // copyable but is move-constructable with the semantics you'd expect. Since the return type is
  // private, you need to assign to an `auto` variable.
  //
  // The KJ_DEFER macro provides slightly more convenient syntax for the common case where you
  // want some code to run at current scope exit.
  //
  // KJ_DEFER does not support move-assignment for its returned objects. If you need to reuse the
  // variable for your deferred function object, then you will want to write your own class for that
  // purpose.

  return _::Deferred<Func>(kj::fwd<Func>(func));
}